

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagFileTest_FilenamesOurfileInBigList::Run(void)

{
  FlagSaver fs;
  FlagSaver local_60;
  string local_58;
  string local_38;
  
  FlagSaver::FlagSaver(&local_60);
  fprintf(_stderr,"Running test %s/%s\n","FlagFileTest","FilenamesOurfileInBigList");
  std::__cxx11::string::_M_replace
            (fLS::FLAGS_test_string_abi_cxx11_,0,*(char **)(fLS::FLAGS_test_string_abi_cxx11_ + 8),
             0x14817b);
  fLB::FLAGS_test_bool = 0;
  fLI::FLAGS_test_int32 = 0xffffffff;
  fLD::FLAGS_test_double = 0xbff0000000000000;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "-test_string=continued\n# some comments are in order\n# some\n  # comments\n#are\n                  #trickier\n# than others\n*first* *flags* *third*\n-test_bool=true\n     -test_int32=1\nflags\n-test_double=1000.0\n"
             ,"");
  local_38.field_2._M_allocated_capacity = 0x65756e69746e6f63;
  local_38.field_2._8_2_ = 100;
  local_38._M_string_length = 9;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  TestFlagString(&local_58,&local_38,true,1,-1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&local_60);
  return;
}

Assistant:

TEST(FlagFileTest, FilenamesOurfileInBigList) {
  FLAGS_test_string = "initial";
  FLAGS_test_bool = false;
  FLAGS_test_int32 = -1;
  FLAGS_test_double = -1.0;
  TestFlagString(
      // Flag string
      "-test_string=continued\n"
      "# some comments are in order\n"
      "# some\n"
      "  # comments\n"
      "#are\n"
      "                  #trickier\n"
      "# than others\n"
      "*first* *flags* *third*\n"
      "-test_bool=true\n"
      "     -test_int32=1\n"
      "flags\n"
      "-test_double=1000.0\n",
      // Expected values
      "continued",
      true,
      1,
      -1.0);
}